

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_decrypt
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *deckey32,
              uchar *adaptor_sig162)

{
  uint uVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  secp256k1_ecdsa_signature *in_RSI;
  int ret;
  int high;
  int overflow;
  secp256k1_scalar sigr;
  secp256k1_scalar s;
  secp256k1_scalar sp;
  secp256k1_scalar deckey;
  secp256k1_scalar *in_stack_00000108;
  secp256k1_scalar *in_stack_00000110;
  char *in_stack_ffffffffffffff38;
  secp256k1_callback *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  secp256k1_ge *in_stack_ffffffffffffff58;
  secp256k1_scalar *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  secp256k1_scalar *in_stack_ffffffffffffff70;
  secp256k1_scalar *in_stack_ffffffffffffff78;
  secp256k1_scalar *in_stack_ffffffffffffff80;
  secp256k1_scalar local_68;
  secp256k1_scalar local_48;
  secp256k1_ecdsa_signature *local_18;
  uint local_4;
  
  uVar3 = 1;
  if (in_RSI == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    secp256k1_scalar_clear(&local_68);
    secp256k1_scalar_set_b32
              ((secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (uchar *)CONCAT44(uVar3,in_stack_ffffffffffffff48),(int *)in_stack_ffffffffffffff40);
    uVar3 = ((in_stack_ffffffffffffff54 != 0 ^ 0xffU) & 1) & uVar3;
    uVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                      ((secp256k1_ge *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                       ,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (secp256k1_scalar *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (secp256k1_scalar *)CONCAT44(uVar3,in_stack_ffffffffffffff48),
                       (secp256k1_scalar *)in_stack_ffffffffffffff40,
                       (uchar *)in_stack_ffffffffffffff80);
    uVar1 = uVar1 & uVar3;
    iVar2 = secp256k1_scalar_is_zero(&local_48);
    uVar1 = ((iVar2 != 0 ^ 0xffU) & 1) & uVar1;
    secp256k1_scalar_inverse(in_stack_00000110,in_stack_00000108);
    secp256k1_scalar_mul
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    secp256k1_scalar_is_high((secp256k1_scalar *)&stack0xffffffffffffff78);
    secp256k1_scalar_cond_negate(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    secp256k1_ecdsa_signature_save
              (local_18,(secp256k1_scalar *)&stack0xffffffffffffff58,
               (secp256k1_scalar *)&stack0xffffffffffffff78);
    secp256k1_memczero(local_18,0x40,(uint)((uVar1 != 0 ^ 0xffU) & 1));
    secp256k1_scalar_clear(&local_48);
    secp256k1_scalar_clear(&local_68);
    secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff78);
    local_4 = uVar1;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_adaptor_decrypt(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sig, const unsigned char *deckey32, const unsigned char *adaptor_sig162) {
    secp256k1_scalar deckey;
    secp256k1_scalar sp;
    secp256k1_scalar s;
    secp256k1_scalar sigr;
    int overflow;
    int high;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(deckey32 != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);

    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_set_b32(&deckey, deckey32, &overflow);
    ret &= !overflow;
    ret &= secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &sigr, NULL, &sp, NULL, NULL, adaptor_sig162);
    ret &= !secp256k1_scalar_is_zero(&deckey);
    secp256k1_scalar_inverse(&s, &deckey);
    /* s = s' * y⁻¹ */
    secp256k1_scalar_mul(&s, &s, &sp);
    high = secp256k1_scalar_is_high(&s);
    secp256k1_scalar_cond_negate(&s, high);
    secp256k1_ecdsa_signature_save(sig, &sigr, &s);

    secp256k1_memczero(&sig->data[0], 64, !ret);
    secp256k1_scalar_clear(&deckey);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return ret;
}